

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int duckdb_je_ctl_bymibname
              (tsd_t *tsd,size_t *mib,size_t miblen,char *name,size_t *miblenp,void *oldp,
              size_t *oldlenp,void *newp,size_t newlen)

{
  size_t sVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  ctl_named_node_t *local_40;
  void *local_38;
  
  local_38 = oldp;
  if ((ctl_initialized == '\0') && (_Var2 = ctl_init(tsd), _Var2)) {
    return 0xb;
  }
  iVar3 = ctl_lookupbymib((tsdn_t *)tsd,&local_40,mib,miblen);
  if (((iVar3 == 0) && (iVar4 = 2, iVar3 = iVar4, local_40 != (ctl_named_node_t *)0x0)) &&
     (local_40->ctl ==
      (_func_int_tsd_t_ptr_size_t_ptr_size_t_void_ptr_size_t_ptr_void_ptr_size_t *)0x0)) {
    *miblenp = *miblenp - miblen;
    iVar3 = ctl_lookup((tsdn_t *)tsd,local_40,name,&local_40,mib + miblen,miblenp);
    sVar1 = *miblenp;
    *miblenp = miblen + sVar1;
    if (((iVar3 == 0) && (iVar3 = iVar4, local_40 != (ctl_named_node_t *)0x0)) &&
       (local_40->ctl !=
        (_func_int_tsd_t_ptr_size_t_ptr_size_t_void_ptr_size_t_ptr_void_ptr_size_t *)0x0)) {
      iVar3 = (*local_40->ctl)(tsd,mib,miblen + sVar1,local_38,oldlenp,newp,newlen);
    }
  }
  return iVar3;
}

Assistant:

int
ctl_bymibname(tsd_t *tsd, size_t *mib, size_t miblen, const char *name,
    size_t *miblenp, void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	const ctl_named_node_t *node;

	if (!ctl_initialized && ctl_init(tsd)) {
		ret = EAGAIN;
		goto label_return;
	}

	ret = ctl_lookupbymib(tsd_tsdn(tsd), &node, mib, miblen);
	if (ret != 0) {
		goto label_return;
	}
	if (node == NULL || node->ctl != NULL) {
		ret = ENOENT;
		goto label_return;
	}

	assert(miblenp != NULL);
	assert(*miblenp >= miblen);
	*miblenp -= miblen;
	/*
	 * The same node supplies the starting node and stores the ending node.
	 */
	ret = ctl_lookup(tsd_tsdn(tsd), node, name, &node, mib + miblen,
	    miblenp);
	*miblenp += miblen;
	if (ret != 0) {
		goto label_return;
	}

	if (node != NULL && node->ctl) {
		ret = node->ctl(tsd, mib, *miblenp, oldp, oldlenp, newp,
		    newlen);
	} else {
		/* The name refers to a partial path through the ctl tree. */
		ret = ENOENT;
	}

label_return:
	return(ret);
}